

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O3

decNumber * uprv_decNumberFromUInt32_63(decNumber *dn,uint32_t uin)

{
  uint8_t *puVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  
  dn->bits = '\0';
  dn->lsu[0] = '\0';
  dn->digits = 1;
  dn->exponent = 0;
  if (uin != 0) {
    puVar1 = dn->lsu;
    lVar4 = 0;
    lVar3 = 0;
    do {
      lVar4 = lVar4 + 0x100000000;
      dn->lsu[lVar3] = (char)uin + (char)(uin / 10) * -10;
      lVar3 = lVar3 + 1;
      bVar2 = 9 < uin;
      uin = uin / 10;
    } while (bVar2);
    if (puVar1 <= puVar1 + (lVar4 >> 0x20) + -1) {
      lVar3 = (long)(int)lVar3;
      do {
        if ((dn->lsu[lVar3 + -1] != '\0') || ((int)lVar3 == 1)) goto LAB_002432af;
        lVar4 = lVar3 + -2;
        lVar3 = lVar3 + -1;
      } while (puVar1 <= dn->lsu + lVar4);
      lVar3 = 0;
    }
LAB_002432af:
    dn->digits = (int32_t)lVar3;
  }
  return dn;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberFromUInt32(decNumber *dn, uInt uin) {
  Unit *up;                             /* work pointer  */
  uprv_decNumberZero(dn);                    /* clean  */
  if (uin==0) return dn;                /* [or decGetDigits bad call]  */
  for (up=dn->lsu; uin>0; up++) {
    *up=(Unit)(uin%(DECDPUNMAX+1));
    uin=uin/(DECDPUNMAX+1);
    }
  dn->digits=decGetDigits(dn->lsu, static_cast<int32_t>(up - dn->lsu));
  return dn;
  }